

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int gladLoadGLLoader(GLADloadproc load)

{
  int iVar1;
  GLubyte *pGVar2;
  code *in_RDI;
  bool local_11;
  uint local_4;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*in_RDI)("glGetString");
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    local_4 = 0;
  }
  else {
    pGVar2 = (*glad_glGetString)(0x1f02);
    if (pGVar2 == (GLubyte *)0x0) {
      local_4 = 0;
    }
    else {
      find_coreGL();
      load_GL_VERSION_1_0((GLADloadproc)0xc25313);
      load_GL_VERSION_1_1((GLADloadproc)0xc2531d);
      load_GL_VERSION_1_2((GLADloadproc)0xc25327);
      load_GL_VERSION_1_3((GLADloadproc)0xc25331);
      load_GL_VERSION_1_4((GLADloadproc)0xc2533b);
      load_GL_VERSION_1_5((GLADloadproc)0xc25345);
      load_GL_VERSION_2_0((GLADloadproc)0xc2534f);
      load_GL_VERSION_2_1((GLADloadproc)0xc25359);
      load_GL_VERSION_3_0((GLADloadproc)0xc25363);
      load_GL_VERSION_3_1((GLADloadproc)0xc2536d);
      load_GL_VERSION_3_2((GLADloadproc)0xc25377);
      load_GL_VERSION_3_3((GLADloadproc)0xc25381);
      iVar1 = find_extensionsGL();
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_11 = GLVersion.major != 0 || GLVersion.minor != 0;
        local_4 = (uint)local_11;
      }
    }
  }
  return local_4;
}

Assistant:

int gladLoadGLLoader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGL();
	load_GL_VERSION_1_0(load);
	load_GL_VERSION_1_1(load);
	load_GL_VERSION_1_2(load);
	load_GL_VERSION_1_3(load);
	load_GL_VERSION_1_4(load);
	load_GL_VERSION_1_5(load);
	load_GL_VERSION_2_0(load);
	load_GL_VERSION_2_1(load);
	load_GL_VERSION_3_0(load);
	load_GL_VERSION_3_1(load);
	load_GL_VERSION_3_2(load);
	load_GL_VERSION_3_3(load);

	if (!find_extensionsGL()) return 0;
	return GLVersion.major != 0 || GLVersion.minor != 0;
}